

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

bool __thiscall
cmTargetPropCommandBase::PopulateTargetProperties
          (cmTargetPropCommandBase *this,string *scope,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  bool bVar1;
  uint uVar2;
  bool system_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  string *scope_local;
  cmTargetPropCommandBase *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(content);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(scope,"PRIVATE");
    if (((bVar1) || (bVar1 = std::operator==(scope,"PUBLIC"), bVar1)) &&
       (uVar2 = (*this->_vptr_cmTargetPropCommandBase[5])
                          (this,this->Target,content,(ulong)prepend,(ulong)system), (uVar2 & 1) == 0
       )) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = std::operator==(scope,"INTERFACE");
      if ((bVar1) || (bVar1 = std::operator==(scope,"PUBLIC"), bVar1)) {
        (*this->_vptr_cmTargetPropCommandBase[2])
                  (this,this->Target,content,(ulong)prepend,(ulong)system);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmTargetPropCommandBase::PopulateTargetProperties(
  const std::string& scope, const std::vector<std::string>& content,
  bool prepend, bool system)
{
  if (content.empty()) {
    return true;
  }
  if (scope == "PRIVATE" || scope == "PUBLIC") {
    if (!this->HandleDirectContent(this->Target, content, prepend, system)) {
      return false;
    }
  }
  if (scope == "INTERFACE" || scope == "PUBLIC") {
    this->HandleInterfaceContent(this->Target, content, prepend, system);
  }
  return true;
}